

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::AsyncInputStream::pumpTo(AsyncInputStream *this,AsyncOutputStream *output,uint64_t amount)

{
  NullableValue<kj::Promise<unsigned_long>_> *other;
  Promise<unsigned_long> *pPVar1;
  Promise<unsigned_long> *pPVar2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 in_RCX;
  Promise<unsigned_long> *result;
  Maybe<kj::Promise<unsigned_long>_> local_48;
  undefined1 local_38 [8];
  NullableValue<kj::Promise<unsigned_long>_> _result146;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  AsyncInputStream *this_local;
  
  _result146.field_1 = in_RCX;
  (**(code **)(*(long *)amount + 0x10))();
  other = kj::_::readMaybe<kj::Promise<unsigned_long>>(&local_48);
  kj::_::NullableValue<kj::Promise<unsigned_long>_>::NullableValue
            ((NullableValue<kj::Promise<unsigned_long>_> *)local_38,other);
  Maybe<kj::Promise<unsigned_long>_>::~Maybe(&local_48);
  pPVar1 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_38);
  if (pPVar1 != (Promise<unsigned_long> *)0x0) {
    pPVar2 = kj::_::NullableValue<kj::Promise<unsigned_long>_>::operator*
                       ((NullableValue<kj::Promise<unsigned_long>_> *)local_38);
    pPVar2 = mv<kj::Promise<unsigned_long>>(pPVar2);
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,pPVar2);
  }
  kj::_::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue
            ((NullableValue<kj::Promise<unsigned_long>_> *)local_38);
  if (pPVar1 == (Promise<unsigned_long> *)0x0) {
    unoptimizedPumpTo((kj *)this,(AsyncInputStream *)output,(AsyncOutputStream *)amount,
                      (uint64_t)_result146.field_1,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> AsyncInputStream::pumpTo(
    AsyncOutputStream& output, uint64_t amount) {
  // See if output wants to dispatch on us.
  KJ_IF_SOME(result, output.tryPumpFrom(*this, amount)) {
    return kj::mv(result);
  }

  // OK, fall back to naive approach.
  return unoptimizedPumpTo(*this, output, amount);
}